

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Driver.c
# Opt level: O2

DdManager * Llb_DriverLastPartition(Aig_Man_t *p,Vec_Int_t *vVarsNs,abctime TimeTarget)

{
  int iVar1;
  DdManager *unique;
  DdNode *n;
  Aig_Obj_t *pObj;
  DdNode *pDVar2;
  DdNode *pDVar3;
  int i;
  
  i = 0;
  unique = Cudd_Init(p->vObjs->nSize,0,0x100,0x40000,0);
  Cudd_AutodynEnable(unique,CUDD_REORDER_SYMM_SIFT);
  unique->TimeStop = TimeTarget;
  n = Cudd_ReadOne(unique);
  Cudd_Ref(n);
  do {
    if (vVarsNs->nSize <= i) {
      Cudd_AutodynDisable(unique);
      unique->bFunc = n;
      unique->TimeStop = 0;
      return unique;
    }
    iVar1 = Vec_IntEntry(vVarsNs,i);
    if (p->vObjs == (Vec_Ptr_t *)0x0) {
      pObj = (Aig_Obj_t *)0x0;
    }
    else {
      pObj = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,iVar1);
    }
    pDVar2 = n;
    if (((*(uint *)&pObj->field_0x18 & 7) == 3) &&
       (iVar1 = Aig_ObjCioId(pObj), p->nTruePos <= iVar1)) {
      pDVar2 = Cudd_bddIthVar(unique,pObj->Id);
      iVar1 = -1;
      if (pObj->pFanin0 != (Aig_Obj_t *)0x0) {
        iVar1 = *(int *)(((ulong)pObj->pFanin0 & 0xfffffffffffffffe) + 0x24);
      }
      pDVar3 = Cudd_bddIthVar(unique,iVar1);
      iVar1 = Aig_ObjIsConst1((Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
      if (iVar1 != 0) {
        pDVar3 = Cudd_ReadOne(unique);
      }
      pDVar3 = Cudd_bddXnor(unique,pDVar2,
                            (DdNode *)((ulong)((uint)pObj->pFanin0 & 1) ^ (ulong)pDVar3));
      Cudd_Ref(pDVar3);
      pDVar2 = Cudd_bddAnd(unique,n,pDVar3);
      if (pDVar2 == (DdNode *)0x0) {
        Cudd_RecursiveDeref(unique,n);
        Cudd_RecursiveDeref(unique,pDVar3);
        return (DdManager *)0x0;
      }
      Cudd_Ref(pDVar2);
      Cudd_RecursiveDeref(unique,n);
      Cudd_RecursiveDeref(unique,pDVar3);
    }
    i = i + 1;
    n = pDVar2;
  } while( true );
}

Assistant:

DdManager * Llb_DriverLastPartition( Aig_Man_t * p, Vec_Int_t * vVarsNs, abctime TimeTarget )
{
//    int fVerbose = 1;
    DdManager * dd;
    DdNode * bVar1, * bVar2, * bProd, * bRes, * bTemp;
    Aig_Obj_t * pObj;
    int i;
    dd = Cudd_Init( Aig_ManObjNumMax(p), 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    Cudd_AutodynEnable( dd, CUDD_REORDER_SYMM_SIFT );
    dd->TimeStop = TimeTarget;
    bRes = Cudd_ReadOne(dd);                                   Cudd_Ref( bRes );

    // mark the duplicated flop inputs
    Aig_ManForEachObjVec( vVarsNs, p, pObj, i )
    {
        if ( !Saig_ObjIsLi(p, pObj) )
            continue;
        bVar1 = Cudd_bddIthVar( dd, Aig_ObjId(pObj) );
        bVar2 = Cudd_bddIthVar( dd, Aig_ObjFaninId0(pObj) );
        if ( Aig_ObjIsConst1(Aig_ObjFanin0(pObj)) )
            bVar2 = Cudd_ReadOne(dd);
        bVar2 = Cudd_NotCond( bVar2, Aig_ObjFaninC0(pObj) );
        bProd = Cudd_bddXnor( dd, bVar1, bVar2 );              Cudd_Ref( bProd );
//        bRes  = Cudd_bddAnd( dd, bTemp = bRes, bProd );        Cudd_Ref( bRes );
//        bRes  = Extra_bddAndTime( dd, bTemp = bRes, bProd, TimeTarget );  
        bRes  = Cudd_bddAnd( dd, bTemp = bRes, bProd );  
        if ( bRes == NULL )
        {
            Cudd_RecursiveDeref( dd, bTemp );
            Cudd_RecursiveDeref( dd, bProd );
            return NULL;
        }        
        Cudd_Ref( bRes );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bProd );
    }

/*
    Saig_ManForEachLi( p, pObj, i )
        printf( "%d ", Aig_ObjId(pObj) );
    printf( "\n" );
    Saig_ManForEachLi( p, pObj, i )
        printf( "%c%d ", Aig_ObjFaninC0(pObj)? '-':'+', Aig_ObjFaninId0(pObj) );
    printf( "\n" );
*/
    Cudd_AutodynDisable( dd );
//    Cudd_RecursiveDeref( dd, bRes );
//    Extra_StopManager( dd );
    dd->bFunc = bRes;
    dd->TimeStop = 0;
    return dd;
}